

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O2

void print_custom_message(object *obj,char *string,wchar_t msg_type,player *p)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  size_t end;
  object *local_450;
  wchar_t local_444;
  player *local_440;
  char buf [1024];
  
  local_440 = p;
  memset(buf,0,0x400);
  end = 0;
  if (string != (char *)0x0) {
    local_450 = obj;
    local_444 = msg_type;
    pcVar4 = strchr(string,0x7b);
    while (pcVar4 != (char *)0x0) {
      strnfcat(buf,0x400,&end,"%.*s",(ulong)(uint)((int)pcVar4 - (int)string),string);
      string = pcVar4 + 1;
      pcVar8 = pcVar4 + 2;
      while( true ) {
        bVar1 = pcVar8[-1];
        if ((ulong)bVar1 == 0) break;
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 4) == 0) {
          if (bVar1 != 0x7d) break;
          iVar3 = strncmp(string,"name",4);
          if (iVar3 == 0) {
            if (local_450 != (object *)0x0) {
              sVar6 = object_desc(buf,0x400,local_450,0x40,local_440);
              end = end + sVar6;
              string = pcVar8;
              break;
            }
LAB_00193975:
            pcVar4 = "hands";
          }
          else {
            iVar3 = strncmp(string,"kind",4);
            if (iVar3 == 0) {
              if (local_450 == (object *)0x0) goto LAB_00193975;
              object_kind_name(buf + end,0x400 - end,local_450->kind,true);
              sVar6 = end;
              sVar7 = strlen(buf + end);
              end = sVar7 + sVar6;
              string = pcVar8;
              break;
            }
            cVar2 = *string;
            if (cVar2 == 'i') {
              string = pcVar8;
              if (pcVar4[2] != 's') break;
              if ((local_450 == (object *)0x0) || (1 < local_450->number)) {
                pcVar4 = "are";
              }
              else {
                pcVar4 = "is";
              }
            }
            else {
              string = pcVar8;
              if (((cVar2 != 's') || (local_450 == (object *)0x0)) || (local_450->number != '\x01'))
              break;
              pcVar4 = "s";
            }
          }
          strnfcat(buf,0x400,&end,pcVar4);
          string = pcVar8;
          break;
        }
        pcVar8 = pcVar8 + 1;
      }
      pcVar4 = strchr(string,0x7b);
    }
    strnfcat(buf,0x400,&end,"%s",string);
    msgt(local_444,"%s",buf);
  }
  return;
}

Assistant:

void print_custom_message(const struct object *obj, const char *string,
		int msg_type, const struct player *p)
{
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	size_t end = 0;

	/* Not always a string */
	if (!string) return;

	next = strchr(string, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - string),
			string);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			string = s + 1;

			switch(msg_tag_lookup(tag)) {
			case MSG_TAG_NAME:
				if (obj) {
					end += object_desc(buf, 1024, obj,
						ODESC_PREFIX | ODESC_BASE, p);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_KIND:
				if (obj) {
					object_kind_name(&buf[end], 1024 - end, obj->kind, true);
					end += strlen(&buf[end]);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_VERB:
				if (obj && obj->number == 1) {
					strnfcat(buf, 1024, &end, "s");
				}
				break;
			case MSG_TAG_VERB_IS:
				if ((!obj) || (obj->number > 1)) {
					strnfcat(buf, 1024, &end, "are");
				} else {
					strnfcat(buf, 1024, &end, "is");
				}
			default:
				break;
			}
		} else
			/* An invalid tag, skip it */
			string = next + 1;

		next = strchr(string, '{');
	}
	strnfcat(buf, 1024, &end, "%s", string);

	msgt(msg_type, "%s", buf);
}